

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O1

void __thiscall Object::visualizeEdges(Object *this,Mat *src,Point *obs)

{
  iterator *this_00;
  _Map_pointer ppMVar1;
  _Elt_pointer pMVar2;
  uint uVar3;
  reference pMVar4;
  size_t sVar5;
  _Elt_pointer pMVar6;
  _Elt_pointer pMVar7;
  ulong __n;
  pointer pEVar8;
  char str [8];
  undefined4 local_e0 [2];
  Mat *local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 uStack_c0;
  long local_b8 [2];
  double local_a8;
  double dStack_a0;
  Point *local_98;
  pointer local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  char local_60 [8];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Point local_38;
  
  if (this->valid != false) {
    pEVar8 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_90 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_98 = obs;
    if (pEVar8 != local_90) {
      uVar3 = 0xffffffff;
      do {
        uVar3 = uVar3 + 1;
        if (pEVar8->valid != false) {
          this_00 = &(pEVar8->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start;
          for (__n = 1; ppMVar1 = (pEVar8->
                                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ).
                                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
              __n < ((long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                    -0x5555555555555555 +
                    ((long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                    -0x5555555555555555 +
                    (((long)ppMVar1 -
                      (long)(pEVar8->
                            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ).
                            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                    (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x15; __n = __n + 1) {
            uStack_d0 = 0;
            local_e0[0] = 0x3010000;
            local_d8 = src;
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n - 1);
            local_a8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0];
            dStack_a0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[1];
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n - 1);
            local_68 = CONCAT44((int)(pMVar4->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data.array[1],(int)local_a8);
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n);
            local_a8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0];
            dStack_a0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[1];
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n);
            local_70 = CONCAT44((int)(pMVar4->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data.array[1],(int)local_a8);
            local_c8 = (long *)0x0;
            uStack_c0 = 0x406fe00000000000;
            local_b8[0] = 0x406fe00000000000;
            local_b8[1] = 0;
            cv::line(local_e0,&local_68,&local_70,&local_c8,3,8,0);
          }
          snprintf(local_60,8,"%d:%lu",(ulong)uVar3);
          uStack_d0 = 0;
          local_e0[0] = 0x3010000;
          local_d8 = src;
          local_c8 = local_b8;
          sVar5 = strlen(local_60);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,local_60,local_60 + sVar5);
          pMVar6 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_78 = CONCAT44((int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1] + 10,
                              (int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0] + 10);
          local_58 = ZEXT816(0x406fe00000000000) << 0x40;
          local_48 = (undefined1  [16])0x0;
          cv::putText(0x3ff0000000000000,local_e0,(string *)&local_c8,&local_78,1,local_58,1,8,0);
          if (local_c8 != local_b8) {
            operator_delete(local_c8,local_b8[0] + 1);
          }
          uStack_d0 = 0;
          local_e0[0] = 0x3010000;
          pMVar6 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_80 = CONCAT44((int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1],
                              (int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0]);
          local_c8 = (long *)0x406fe00000000000;
          uStack_c0 = 0x406fe00000000000;
          local_b8[0] = 0;
          local_b8[1] = 0;
          local_d8 = src;
          cv::circle(local_e0,&local_80,3,&local_c8,0xffffffff,8,0);
          uStack_d0 = 0;
          local_e0[0] = 0x3010000;
          pMVar6 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pMVar2 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          pMVar7 = pMVar6;
          if (pMVar6 == pMVar2) {
            pMVar7 = (pEVar8->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          if (pMVar6 == pMVar2) {
            pMVar6 = (pEVar8->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          local_88 = CONCAT44((int)pMVar6[-1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1],
                              (int)pMVar7[-1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0]);
          local_c8 = (long *)0x406fe00000000000;
          uStack_c0 = 0;
          local_b8[0] = 0x406fe00000000000;
          local_b8[1] = 0;
          local_d8 = src;
          cv::circle(local_e0,&local_88,3,&local_c8,0xffffffff,8,0);
        }
        pEVar8 = pEVar8 + 1;
      } while (pEVar8 != local_90);
    }
    uStack_d0 = 0;
    local_e0[0] = 0x3010000;
    local_38 = *local_98;
    local_c8 = (long *)0x0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    uStack_c0 = 0x406fe00000000000;
    local_d8 = src;
    cv::circle(local_e0,&local_38,4,&local_c8,0xffffffff,8,0);
  }
  return;
}

Assistant:

void Object::visualizeEdges(cv::Mat& src, cv::Point obs) const{
    if (valid == false)
        return;
    int cnt = -1;
    for (const Edge& eg: edges) {
        cnt++;
        if (eg.valid == false) continue;
        for (size_t i = 1; i < eg.size(); i++) {
            cv::line(src, cv::Point(eg[i - 1].x(), eg[i - 1].y()), cv::Point(eg[i].x(), eg[i].y()), cv::Scalar(0, 255, 255), 3);
        }
        char str[8];
        snprintf(str, 8, "%d:%lu", cnt, eg.size());
		cv::putText(src, str, cv::Point(eg.front().x(), eg.front().y()) + cv::Point(10, 10),
					cv::FONT_HERSHEY_PLAIN, 1, cv::Scalar(0, 255, 0));
        cv::circle(src, cv::Point(eg.front().x(), eg.front().y()), 3, cv::Scalar(255, 255, 0), -1);
        cv::circle(src, cv::Point(eg.back().x(), eg.back().y()), 3, cv::Scalar(255, 0, 255), -1);
    }
    cv::circle(src, obs, 4, cv::Scalar(0, 255, 0), -1);
}